

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

pair<int,_int> embree::quad_index3(int a0,int a1,int a2,int b0,int b1,int b2)

{
  pair<int,_int> pVar1;
  pair<int,_int> pVar2;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  pair<int,_int> pVar10;
  pair<int,_int> pVar3;
  pair<int,_int> pVar4;
  pair<int,_int> pVar5;
  pair<int,_int> pVar6;
  
  uVar9 = (ulong)(uint)b2;
  uVar8 = (ulong)(uint)b1;
  uVar7 = (ulong)(uint)b0;
  if (b0 == a0) {
    if (b1 == a2) {
      return (pair<int,_int>)(uVar9 << 0x20 | 0xffffffff);
    }
    if (b1 != a1) {
      if (b2 == a2) {
        return (pair<int,_int>)(uVar8 << 0x20 | 0xffffffff);
      }
      if (b2 != a1) {
        pVar6.first = 0;
        pVar6.second = -1;
        return pVar6;
      }
LAB_001494b8:
      return (pair<int,_int>)(uVar8 << 0x20);
    }
LAB_00149461:
    pVar10 = (pair<int,_int>)(uVar9 << 0x20);
  }
  else {
    if (b0 == a1) {
      if (b1 == a0) goto LAB_00149461;
      if (b1 != a2) {
        if (b2 != a0) {
          if (b2 != a2) {
            pVar3.first = 0;
            pVar3.second = -1;
            return pVar3;
          }
          goto LAB_001494df;
        }
        goto LAB_001494b8;
      }
    }
    else {
      if (b0 != a2) {
        if (b1 == a0) {
          if (b2 == a2) {
            return (pair<int,_int>)(uVar7 << 0x20 | 0xffffffff);
          }
          if (b2 != a1) {
            pVar2.first = 0;
            pVar2.second = -1;
            return pVar2;
          }
LAB_001494d4:
          pVar10 = (pair<int,_int>)(uVar7 << 0x20);
        }
        else {
          if (b1 == a1) {
            if (b2 == a0) goto LAB_001494d4;
            if (b2 != a2) {
              pVar4.first = 0;
              pVar4.second = -1;
              return pVar4;
            }
          }
          else {
            if (b1 != a2) {
              pVar10.first = 0;
              pVar10.second = -1;
              return pVar10;
            }
            if (b2 != a1) {
              if (b2 != a0) {
                pVar1.first = 0;
                pVar1.second = -1;
                return pVar1;
              }
              return (pair<int,_int>)(uVar7 << 0x20 | 2);
            }
          }
          pVar10 = (pair<int,_int>)((uVar7 << 0x20) + 1);
        }
        return pVar10;
      }
      if (b1 != a1) {
        if (b1 == a0) {
          return (pair<int,_int>)(uVar9 << 0x20 | 2);
        }
        if (b2 != a1) {
          if (b2 == a0) {
            return (pair<int,_int>)(uVar8 << 0x20 | 2);
          }
          pVar5.first = 0;
          pVar5.second = -1;
          return pVar5;
        }
LAB_001494df:
        return (pair<int,_int>)((uVar8 << 0x20) + 1);
      }
    }
    pVar10 = (pair<int,_int>)((uVar9 << 0x20) + 1);
  }
  return pVar10;
}

Assistant:

std::pair<int,int> quad_index3(int a0, int a1, int a2, int b0, int b1, int b2)
  {
    if      (b0 == a0) return quad_index2(0,a2,a1,b1,b2);
    else if (b0 == a1) return quad_index2(1,a0,a2,b1,b2);
    else if (b0 == a2) return quad_index2(2,a1,a0,b1,b2);
    else if (b1 == a0) return quad_index2(0,a2,a1,b0,b2);
    else if (b1 == a1) return quad_index2(1,a0,a2,b0,b2);
    else if (b1 == a2) return quad_index2(2,a1,a0,b0,b2);
    else if (b2 == a0) return quad_index2(0,a2,a1,b0,b1);
    else if (b2 == a1) return quad_index2(1,a0,a2,b0,b1);
    else if (b2 == a2) return quad_index2(2,a1,a0,b0,b1);
    else return std::make_pair(0,-1);
  }